

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers_test.cpp
# Opt level: O2

void __thiscall
UniformLightSampling_PdfMethod_Test::TestBody(UniformLightSampling_PdfMethod_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer pLVar3;
  memory_resource *pmVar4;
  Allocator alloc;
  SampledLight *pSVar5;
  Message *message;
  Allocator alloc_00;
  int iVar6;
  char *message_00;
  char *in_R9;
  long lVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 in_XMM2 [16];
  span<const_pbrt::LightHandle> lights_00;
  AssertHelper local_128;
  AssertHelper local_120;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  Point3<float> local_e4;
  vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> tris;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights;
  optional<pbrt::SampledLight> sampledLight;
  UniformLightSampler distrib;
  RNG rng;
  undefined1 extraout_var [60];
  
  pbrt::RNG::SetSequence(&rng,0x1483);
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tris.super__Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tris.super__Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tris.super__Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pmVar4 = pstd::pmr::new_delete_resource();
  randomLights((tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
                *)&distrib,(int)pmVar4,alloc_00);
  gtest_ar._0_8_ = &tris;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lights;
  std::
  tuple<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,std::vector<pbrt::ShapeHandle,std::allocator<pbrt::ShapeHandle>>&>
  ::operator=((tuple<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,std::vector<pbrt::ShapeHandle,std::allocator<pbrt::ShapeHandle>>&>
               *)&gtest_ar,
              (tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
               *)&distrib);
  std::
  _Tuple_impl<0UL,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
                  *)&distrib);
  pLVar3 = lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  lights_00.n = lVar7 >> 3;
  lights_00.ptr = pLVar3;
  pbrt::UniformLightSampler::UniformLightSampler(&distrib,lights_00,alloc);
  iVar6 = 0;
  do {
    if (iVar6 == 100) {
LAB_0030fbb3:
      pstd::vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_>::~vector
                (&distrib.lights);
      std::_Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>::~_Vector_base
                (&tris.super__Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>);
      std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base
                (&lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>);
      return;
    }
    fVar9 = pbrt::RNG::Uniform<float>(&rng);
    auVar1 = vfmadd132ss_fma(ZEXT416((uint)fVar9),SUB6416(ZEXT464(0xbf800000),0),ZEXT416(0x40400000)
                            );
    fVar9 = pbrt::RNG::Uniform<float>(&rng);
    auVar10._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    auVar10._4_60_ = extraout_var;
    auVar8._4_4_ = extraout_XMM0_Db;
    auVar8._0_4_ = fVar9;
    auVar8._8_4_ = extraout_XMM0_Dc;
    auVar8._12_4_ = extraout_XMM0_Dd;
    auVar8 = vinsertps_avx(auVar8,auVar10._0_16_,0x10);
    auVar11._8_4_ = 0xbf800000;
    auVar11._0_8_ = 0xbf800000bf800000;
    auVar11._12_4_ = 0xbf800000;
    auVar2._8_4_ = 0x40400000;
    auVar2._0_8_ = 0x4040000040400000;
    auVar2._12_4_ = 0x40400000;
    auVar8 = vfmadd132ps_avx512vl(auVar8,auVar11,auVar2);
    local_e4.super_Tuple3<pbrt::Point3,_float>._4_8_ = vmovlps_avx(auVar8);
    local_e4.super_Tuple3<pbrt::Point3,_float>.x = auVar1._0_4_;
    fVar9 = pbrt::RNG::Uniform<float>(&rng);
    pbrt::UniformLightSampler::Sample(&sampledLight,&distrib,fVar9);
    gtest_ar_.success_ = sampledLight.set;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (sampledLight.set == false) {
      testing::Message::Message((Message *)&local_128);
      std::ostream::operator<<(&(local_128.data_)->line,iVar6);
      std::operator<<((ostream *)&(local_128.data_)->line," - ");
      message = testing::Message::operator<<((Message *)&local_128,&local_e4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(bool)sampledLight",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lightsamplers_test.cpp"
                 ,0x146,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_120,message);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_128);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
      goto LAB_0030fbb3;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    pSVar5 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
    fVar9 = pSVar5->pdf;
    pstd::optional<pbrt::SampledLight>::value(&sampledLight);
    auVar8 = vcvtusi2ss_avx512f(in_XMM2,distrib.lights.nStored);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar,"sampledLight->pdf","distrib.PDF(intr, sampledLight->light)",
               fVar9,(float)((uint)(distrib.lights.nStored != 0) * (int)(1.0 / auVar8._0_4_)));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      message_00 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message_00 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lightsamplers_test.cpp"
                 ,0x147,message_00);
      testing::internal::AssertHelper::operator=(&local_128,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

TEST(UniformLightSampling, PdfMethod) {
    RNG rng(5251);
    auto r = [&rng]() { return rng.Uniform<Float>(); };

    std::vector<LightHandle> lights;
    std::vector<ShapeHandle> tris;
    std::tie(lights, tris) = randomLights(20, Allocator());

    UniformLightSampler distrib(lights, Allocator());
    for (int i = 0; i < 100; ++i) {
        Point3f p(-1 + 3 * r(), -1 + 3 * r(), -1 + 3 * r());
        Interaction intr(Point3fi(p), Normal3f(0, 0, 0), Point2f(0, 0));
        pstd::optional<SampledLight> sampledLight =
            distrib.Sample(intr, rng.Uniform<Float>());
        ASSERT_TRUE((bool)sampledLight) << i << " - " << p;
        EXPECT_FLOAT_EQ(sampledLight->pdf, distrib.PDF(intr, sampledLight->light));
    }
}